

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

int asl::Process::exec(String *command,Array<asl::String> *args)

{
  char **ppcVar1;
  int iVar2;
  String *pSVar3;
  long lVar4;
  anon_union_16_2_78e7fdac_for_String_2 *__file;
  long lVar5;
  Array<const_char_*> argv;
  Array<const_char_*> local_48;
  anon_union_16_2_78e7fdac_for_String_2 *local_40;
  anon_union_16_2_78e7fdac_for_String_2 *local_38;
  
  Array<const_char_*>::alloc(&local_48,0);
  local_38 = &command->field_2;
  local_40 = local_38;
  if (command->_size != 0) {
    local_40 = (anon_union_16_2_78e7fdac_for_String_2 *)(command->field_2)._str;
  }
  Array<const_char_*>::insert(&local_48,-1,(char **)&local_40);
  pSVar3 = args->_a;
  if (0 < *(int *)&pSVar3[-1].field_2) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      if (*(int *)((long)pSVar3 + lVar4 + -8) == 0) {
        local_40 = (anon_union_16_2_78e7fdac_for_String_2 *)((long)&pSVar3->_size + lVar4);
      }
      else {
        local_40 = *(anon_union_16_2_78e7fdac_for_String_2 **)((long)&pSVar3->_size + lVar4);
      }
      Array<const_char_*>::insert(&local_48,-1,(char **)&local_40);
      lVar5 = lVar5 + 1;
      pSVar3 = args->_a;
      lVar4 = lVar4 + 0x18;
    } while (lVar5 < *(int *)&pSVar3[-1].field_2);
  }
  local_40 = (anon_union_16_2_78e7fdac_for_String_2 *)0x0;
  Array<const_char_*>::insert(&local_48,-1,(char **)&local_40);
  __file = local_38;
  if (command->_size != 0) {
    __file = (anon_union_16_2_78e7fdac_for_String_2 *)(command->field_2)._str;
  }
  iVar2 = execvp(__file->_space,local_48._a);
  LOCK();
  ppcVar1 = local_48._a + -1;
  *(int *)ppcVar1 = *(int *)ppcVar1 + -1;
  UNLOCK();
  if (*(int *)ppcVar1 == 0) {
    free(local_48._a + -2);
  }
  return iVar2;
}

Assistant:

int Process::exec(const String& command, const Array<String>& args)
{
	Array<const char*> argv;
	argv << command;
	for(int i=0; i<args.length(); i++)
		argv << args[i];
	argv << 0;
	return execvp(command, (char* const*)argv.data());
}